

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O1

Result __thiscall
PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
::Poll(PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
       *this)

{
  Result RVar1;
  ulong uVar2;
  states *psVar3;
  
  putchar(10);
  psVar3 = &this->nested_state;
  RVar1 = (*SCoro::Impl::
            GetImpl<SCoro::SCoro<PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>::PrintPlus,_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>::PrintNewline>,_std::integer_sequence<unsigned_long,_0UL,_1UL>_>
            ::lut[(this->nested_state).super_EboIndex<2UL>.index])(psVar3);
  if (RVar1.value != Yield) {
    if (RVar1.value == Next) {
      uVar2 = (psVar3->super_EboIndex<2UL>).index + 1;
      (psVar3->super_EboIndex<2UL>).index = uVar2;
      RVar1.value = Next - (uVar2 < 2);
    }
    else {
      RVar1.value = Next;
    }
  }
  return (Result)RVar1.value;
}

Assistant:

SCoro::Result Poll() noexcept
    {
        std::printf("\n");
        return !nested_state.Poll();
    }